

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O1

BVSparseNode * __thiscall
BVSparse<Memory::Recycler>::NodeFromIndex
          (BVSparse<Memory::Recycler> *this,BVIndex i,Type **prevNextFieldOut)

{
  Type *addr;
  uint uVar1;
  uint uVar2;
  BVSparse<Memory::Recycler> *pBVar3;
  BVSparseNode<Memory::Recycler> *pBVar4;
  BVSparse<Memory::Recycler> *pBVar5;
  BVSparse<Memory::Recycler> *pBVar6;
  BVSparse<Memory::Recycler> *pBVar7;
  uint uVar8;
  
  uVar8 = i & 0xffffffc0;
  addr = &this->lastFoundIndex;
  pBVar3 = (BVSparse<Memory::Recycler> *)(this->head).ptr;
  if (pBVar3 != (BVSparse<Memory::Recycler> *)0x0) {
    uVar1 = *(uint *)&(pBVar3->lastFoundIndex).ptr;
    if (uVar1 == uVar8) {
      *prevNextFieldOut = &this->head;
      return (BVSparseNode *)pBVar3;
    }
    pBVar6 = (BVSparse<Memory::Recycler> *)(this->lastFoundIndex).ptr;
    pBVar5 = this;
    pBVar7 = pBVar3;
    if ((pBVar6 != (BVSparse<Memory::Recycler> *)0x0) &&
       (uVar2 = *(uint *)&(pBVar6->lastFoundIndex).ptr, uVar2 != uVar1)) {
      if (uVar2 == uVar8) {
        *prevNextFieldOut = addr;
        return (BVSparseNode *)pBVar6;
      }
      pBVar5 = (BVSparse<Memory::Recycler> *)addr;
      pBVar7 = pBVar6;
      if (uVar8 <= uVar2) {
        pBVar5 = this;
        pBVar7 = pBVar3;
      }
    }
    if (*(uint *)&(pBVar7->lastFoundIndex).ptr <= uVar8) {
      pBVar3 = pBVar7;
      this = pBVar5;
    }
  }
  while( true ) {
    pBVar6 = pBVar3;
    if (pBVar6 == (BVSparse<Memory::Recycler> *)0x0) {
      pBVar4 = (this->head).ptr;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = pBVar4;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      return (BVSparseNode *)0x0;
    }
    if (uVar8 <= *(uint *)&(pBVar6->lastFoundIndex).ptr) break;
    pBVar3 = (BVSparse<Memory::Recycler> *)(pBVar6->head).ptr;
    this = pBVar6;
  }
  pBVar4 = (this->head).ptr;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pBVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  if (uVar8 != *(Type *)&(pBVar6->lastFoundIndex).ptr) {
    return (BVSparseNode *)0x0;
  }
  *prevNextFieldOut = &this->head;
  return (BVSparseNode *)pBVar6;
}

Assistant:

const BVSparseNode<TAllocator> *
BVSparse<TAllocator>::NodeFromIndex(BVIndex i, Field(BVSparseNode*, TAllocator) const** prevNextFieldOut) const
{
    const BVIndex searchIndex = SparseBVUnit::Floor(i);

    Field(BVSparseNode*, TAllocator) const* prevNextField = &this->head;
    Field(BVSparseNode*, TAllocator) const* prevLastField = &this->lastFoundIndex;

    const BVSparseNode * curNode  = *prevNextField,
                       * lastNode = *prevLastField;
    if (curNode != nullptr)
    {
        if (curNode->startIndex == searchIndex)
        {
            *prevNextFieldOut = prevNextField;
            return curNode;
        }

        if (lastNode && lastNode->startIndex != curNode->startIndex)
        {
            if (lastNode->startIndex == searchIndex)
            {
                *prevNextFieldOut = prevLastField;
                return lastNode;
            }

            if (lastNode->startIndex < searchIndex)
            {
                prevNextField = &this->lastFoundIndex;
                curNode = this->lastFoundIndex;
            }
        }

        if (curNode->startIndex > searchIndex)
        {
            prevNextField = &this->head;
            curNode = this->head;
        }
    }
    else
    {
        prevNextField = &this->head;
        curNode = this->head;
    }

    for (; curNode && searchIndex > curNode->startIndex; curNode = curNode->next)
    {
        prevNextField = &curNode->next;
    }

    const_cast<BVSparse<TAllocator>*>(this)->lastFoundIndex = *prevNextField;

    if (curNode && searchIndex == curNode->startIndex)
    {
        *prevNextFieldOut = prevNextField;
        return curNode;
    }

    return nullptr;
}